

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSizeLong(DescriptorProto_ExtensionRange *this)

{
  int iVar1;
  long lVar2;
  anon_union_24_1_493b367e_for_DescriptorProto_ExtensionRange_3 aVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  aVar3 = this->field_0;
  if (((undefined1  [24])aVar3 & (undefined1  [24])0x7) == (undefined1  [24])0x0) {
    sVar6 = 0;
  }
  else {
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = ExtensionRangeOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar5 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      uVar4 = (long)(this->field_0)._impl_.start_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x4) != (undefined1  [24])0x0) {
      uVar4 = (long)(this->field_0)._impl_.end_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t DescriptorProto_ExtensionRange::ByteSizeLong() const {
  const DescriptorProto_ExtensionRange& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto.ExtensionRange)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional .google.protobuf.ExtensionRangeOptions options = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional int32 start = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_start());
    }
    // optional int32 end = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_end());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}